

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_get_next_tensor(ggml_context *ctx,ggml_tensor *tensor)

{
  long *plVar1;
  
  plVar1 = (long *)tensor[-1].extra;
  if (plVar1 != (long *)0x0) {
    do {
      if ((int)plVar1[3] == 0) {
        return (ggml_tensor *)((long)ctx->mem_buffer + *plVar1);
      }
      plVar1 = (long *)plVar1[2];
    } while (plVar1 != (long *)0x0);
  }
  return (ggml_tensor *)0x0;
}

Assistant:

struct ggml_tensor * ggml_get_next_tensor(const struct ggml_context * ctx, struct ggml_tensor * tensor) {
    struct ggml_object * obj = (struct ggml_object *) ((char *)tensor - GGML_OBJECT_SIZE);
    obj = obj->next;

    char * const mem_buffer = ctx->mem_buffer;

    while (obj != NULL) {
        if (obj->type == GGML_OBJECT_TYPE_TENSOR) {
            return (struct ggml_tensor *)(mem_buffer + obj->offs);
        }

        obj = obj->next;
    }

    return NULL;
}